

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbdstrmatrix.cpp
# Opt level: O3

TPZStructMatrix * __thiscall
TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>::Clone
          (TPZBlockDiagonalStructMatrix<std::complex<double>,_TPZStructMatrixOR<std::complex<double>_>_>
           *this)

{
  long lVar1;
  TPZStructMatrix *this_00;
  
  this_00 = (TPZStructMatrix *)operator_new(0xc0);
  lVar1 = *(long *)(*(long *)&(this->super_TPZStructMatrixT<std::complex<double>_>).
                              super_TPZStructMatrix + -0x60);
  *(undefined8 *)(this_00 + 1) = 0x19677b8;
  *(undefined8 *)this_00 = 0x1967880;
  *(undefined4 *)&this_00[1].fMesh =
       *(undefined4 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1);
  *(undefined1 *)((long)&this_00[1].fMesh + 4) =
       *(undefined1 *)
        ((long)&(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh +
        lVar1 + 4);
  TPZStructMatrix::TPZStructMatrix
            (this_00,&PTR_construction_vtable_104__019670c0,(TPZStructMatrix *)this);
  *(undefined8 *)(this_00 + 1) = 0x1967040;
  *(undefined8 *)this_00 = 0x1966e78;
  *(undefined8 *)&this_00->field_0xa0 = 0x1966f40;
  *(undefined8 *)&this_00->field_0xa8 =
       *(undefined8 *)
        &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.field_0xa8;
  return this_00;
}

Assistant:

TPZStructMatrix * TPZBlockDiagonalStructMatrix<TVar,TPar>::Clone(){
    return new TPZBlockDiagonalStructMatrix(*this);
}